

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,string *fromFile)

{
  cmExecutionStatus *this_00;
  char local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  string *local_18;
  string *fromFile_local;
  cmFileCopier *this_local;
  
  this_00 = this->Status;
  local_18 = fromFile;
  fromFile_local = (string *)this;
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  local_59 = '.';
  cmStrCat<char_const*&,char_const(&)[15],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char>
            (&local_38,&this->Name,(char (*) [15])" cannot find \"",fromFile,(char (*) [4])0x1001dbf
             ,&local_58,&local_59);
  cmExecutionStatus::SetError(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return false;
}

Assistant:

bool cmFileCopier::ReportMissing(const std::string& fromFile)
{
  // The input file does not exist and installation is not optional.
  this->Status.SetError(cmStrCat(this->Name, " cannot find \"", fromFile,
                                 "\": ", cmSystemTools::GetLastSystemError(),
                                 '.'));
  return false;
}